

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

IOFileUD * io_file_open(lua_State *L,char *mode)

{
  GCstr *pGVar1;
  IOFileUD *pIVar2;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  char *in_RSI;
  lua_State *in_RDI;
  IOFileUD *iof;
  char *fname;
  lua_State *in_stack_ffffffffffffffd0;
  lua_State *L_00;
  undefined8 in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  
  pGVar1 = lj_lib_checkstr(in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20)
                          );
  L_00 = (lua_State *)(pGVar1 + 1);
  pIVar2 = io_file_new(in_stack_ffffffffffffffd0);
  pFVar3 = fopen64((char *)L_00,in_RSI);
  pIVar2->fp = (FILE *)pFVar3;
  if (pIVar2->fp == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    lj_strfmt_pushf(in_RDI,"%s: %s",L_00,pcVar5);
    luaL_argerror(L_00,(int)((ulong)in_RDI >> 0x20),(char *)0x139f0f);
  }
  return pIVar2;
}

Assistant:

static IOFileUD *io_file_open(lua_State *L, const char *mode)
{
  const char *fname = strdata(lj_lib_checkstr(L, 1));
  IOFileUD *iof = io_file_new(L);
  iof->fp = fopen(fname, mode);
  if (iof->fp == NULL)
    luaL_argerror(L, 1, lj_strfmt_pushf(L, "%s: %s", fname, strerror(errno)));
  return iof;
}